

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void roaring_bitmap_add_range_closed(roaring_bitmap_t *r,uint32_t min,uint32_t max)

{
  uint16_t *__src;
  uint8_t uVar1;
  ushort uVar2;
  uint8_t *puVar3;
  uint uVar4;
  shared_container_t *sc;
  array_container_t *ac;
  byte bVar5;
  uint in_ECX;
  int iVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  roaring_bitmap_t *prVar11;
  array_container_t *paVar12;
  array_container_t *paVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  uint16_t *puVar21;
  int iVar22;
  int iVar23;
  ushort uVar24;
  ushort uVar25;
  uint uVar26;
  uint uVar27;
  byte bVar28;
  bool bVar29;
  uint8_t new_type;
  int32_t union_cardinality;
  uint8_t local_79;
  roaring_bitmap_t *local_78;
  ulong local_70;
  uint local_64;
  array_container_t *local_60;
  ulong local_58;
  uint16_t *local_50;
  uint32_t local_44;
  uint local_40;
  uint local_3c;
  ulong local_38;
  roaring_bitmap_t *prVar17;
  
  if (min <= max) {
    uVar26 = min >> 0x10;
    uVar19 = (ulong)uVar26;
    uVar4 = max >> 0x10;
    puVar21 = (r->high_low_container).keys;
    uVar10 = (r->high_low_container).size;
    uVar27 = 0;
    uVar15 = 0;
    prVar17 = r;
    if (uVar10 != 0) {
      prVar11 = (roaring_bitmap_t *)(ulong)(uVar10 - 1);
      uVar15 = 0;
      do {
        if ((int)prVar11 < (int)uVar15) {
          uVar14 = ~uVar15;
          break;
        }
        uVar18 = uVar15 + (int)prVar11;
        uVar14 = uVar18 >> 1;
        prVar17 = (roaring_bitmap_t *)(ulong)uVar14;
        uVar25 = *(ushort *)((long)puVar21 + (ulong)(uVar18 & 0xfffffffe));
        local_64._0_2_ = (ushort)(max >> 0x10);
        if (uVar25 < (ushort)local_64) {
          uVar15 = uVar14 + 1;
          bVar29 = true;
          prVar17 = (roaring_bitmap_t *)(ulong)uVar15;
          uVar14 = in_ECX;
        }
        else if ((ushort)local_64 < uVar25) {
          prVar11 = (roaring_bitmap_t *)(ulong)(uVar14 - 1);
          bVar29 = true;
          prVar17 = prVar11;
          uVar14 = in_ECX;
        }
        else {
          bVar29 = false;
        }
        in_ECX = uVar14;
      } while (bVar29);
      uVar15 = uVar14 + 1;
      if (-1 < (int)uVar14) {
        uVar15 = ~uVar14;
      }
      uVar15 = uVar15 + uVar10;
    }
    if (uVar10 != uVar15) {
      iVar6 = ~uVar15 + uVar10;
      uVar14 = 0;
      do {
        if (iVar6 < (int)uVar14) {
          uVar27 = ~uVar14;
          break;
        }
        uVar27 = uVar14 + iVar6 >> 1;
        prVar11 = (roaring_bitmap_t *)(ulong)uVar27;
        uVar25 = *(ushort *)((long)puVar21 + (ulong)(uVar14 + iVar6 & 0xfffffffe));
        uVar24 = (ushort)(min >> 0x10);
        if (uVar25 < uVar24) {
          uVar14 = uVar27 + 1;
          bVar29 = true;
          prVar11 = prVar17;
        }
        else if (uVar24 < uVar25) {
          iVar6 = uVar27 - 1;
          bVar29 = true;
          prVar11 = prVar17;
        }
        else {
          bVar29 = false;
        }
        uVar27 = (uint)prVar11;
        prVar17 = prVar11;
      } while (bVar29);
      uVar27 = (int)uVar27 >> 0x1f ^ uVar27;
    }
    iVar6 = (uVar10 - uVar15) - uVar27;
    local_78 = r;
    local_64 = uVar4;
    local_44 = min;
    if (iVar6 <= (int)(uVar4 - uVar26)) {
      ra_shift_tail(&r->high_low_container,uVar15,((uVar4 - uVar26) - iVar6) + 1);
    }
    if (local_64 != uVar26 - 1) {
      uVar4 = (uVar27 + iVar6) - 1;
      local_44 = local_44 & 0xffff;
      local_3c = max & 0xffff;
      lVar9 = (long)(int)(~uVar15 + (local_78->high_low_container).size);
      uVar10 = local_64;
      local_70 = uVar19;
      do {
        uVar15 = 0;
        if ((uint)uVar19 == uVar10) {
          uVar15 = local_44;
        }
        uVar27 = 0xffff;
        if (local_64 == uVar10) {
          uVar27 = local_3c;
        }
        if (((int)uVar4 < 0) ||
           (uVar19 = (ulong)uVar4, uVar10 != (local_78->high_low_container).keys[uVar19])) {
          if ((uVar27 - uVar15) + 2 < 3) {
            local_79 = '\x02';
            ac = array_container_create_range(uVar15,uVar27 + 1);
            uVar19 = local_70;
          }
          else {
            local_79 = '\x03';
            ac = (array_container_t *)run_container_create_given_capacity(1);
            uVar19 = local_70;
            if (ac != (array_container_t *)0x0) {
              *(uint *)(ac->array + (long)ac->cardinality * 2) =
                   (uVar27 - uVar15) * 0x10000 | uVar15;
              ac->cardinality = ac->cardinality + 1;
            }
          }
        }
        else {
          uVar26 = uVar4 & 0xffff;
          puVar3 = (local_78->high_low_container).typecodes;
          sc = (shared_container_t *)(local_78->high_low_container).containers[uVar26];
          local_58 = uVar19;
          local_40 = uVar4;
          if (puVar3[uVar26] == '\x04') {
            sc = (shared_container_t *)shared_container_extract_copy(sc,puVar3 + uVar26);
          }
          (local_78->high_low_container).containers[uVar26] = sc;
          ac = (array_container_t *)(local_78->high_low_container).containers[local_58];
          uVar1 = (local_78->high_low_container).typecodes[local_58];
          uVar24 = (ushort)uVar27;
          uVar25 = (ushort)uVar15;
          if (uVar1 == '\x03') {
            puVar21 = ac->array;
            iVar6 = ac->cardinality;
            uVar4 = 0;
            iVar23 = 0;
            if (iVar6 != 0) {
              iVar16 = iVar6 + -1;
              iVar22 = 0;
              do {
                if (iVar16 < iVar22) {
                  iVar23 = iVar6 - iVar22;
                  break;
                }
                uVar26 = (uint)(iVar22 + iVar16) >> 1;
                if ((ushort)(puVar21[(ulong)uVar26 * 2 + 1] + puVar21[(ulong)uVar26 * 2]) < uVar24)
                {
                  iVar22 = uVar26 + 1;
                  bVar29 = true;
                }
                else if (uVar27 + 1 < (uint)puVar21[(ulong)uVar26 * 2]) {
                  iVar16 = uVar26 - 1;
                  bVar29 = true;
                }
                else {
                  iVar23 = ~uVar26 + iVar6;
                  bVar29 = false;
                }
              } while (bVar29);
            }
            iVar16 = iVar6 - iVar23;
            if (iVar16 != 0) {
              iVar22 = iVar16 + -1;
              uVar26 = uVar4;
              uVar14 = 0;
              do {
                uVar4 = uVar14;
                if (iVar22 < (int)uVar4) break;
                uVar18 = uVar4 + iVar22 >> 1;
                if ((ushort)(puVar21[(ulong)uVar18 * 2 + 1] + puVar21[(ulong)uVar18 * 2]) + 1 <
                    uVar15) {
                  bVar29 = true;
                  uVar14 = uVar18 + 1;
                }
                else {
                  uVar14 = uVar4;
                  if (uVar25 < puVar21[(ulong)uVar18 * 2]) {
                    iVar22 = uVar18 - 1;
                    bVar29 = true;
                  }
                  else {
                    bVar29 = false;
                    uVar26 = uVar18;
                  }
                }
                uVar4 = uVar26;
                uVar26 = uVar4;
              } while (bVar29);
            }
            iVar22 = uVar4 + iVar23 + 1;
            if (iVar22 * 4 < 0x2001) {
              uVar19 = (ulong)(int)uVar4;
              if (iVar6 == uVar4 + iVar23) {
                local_60 = ac;
                if (ac->capacity <= iVar6) {
                  run_container_grow((run_container_t *)ac,iVar6 + 1,true);
                }
                uVar8 = uVar19 & 0xffff;
                memmove(ac->array + uVar8 * 2 + 2,ac->array + uVar8 * 2,
                        ((long)ac->cardinality - uVar8) * 4);
                ac->cardinality = ac->cardinality + 1;
                puVar21 = ac->array;
                puVar21[uVar19 * 2] = uVar25;
                puVar21[uVar19 * 2 + 1] = uVar24 - uVar25;
              }
              else {
                __src = puVar21 + (long)iVar16 * 2;
                if (puVar21[uVar19 * 2] < uVar15) {
                  uVar15 = (uint)puVar21[uVar19 * 2];
                }
                uVar26 = (uint)__src[-1] + (uint)__src[-2];
                if ((uint)__src[-1] + (uint)__src[-2] <= uVar27) {
                  uVar26 = uVar27;
                }
                puVar21[uVar19 * 2] = (uint16_t)uVar15;
                puVar21[uVar19 * 2 + 1] = (short)uVar26 - (uint16_t)uVar15;
                local_60 = ac;
                memmove(puVar21 + (long)(int)(uVar4 + 1) * 2,__src,(long)iVar23 << 2);
                local_60->cardinality = iVar22;
                ac = local_60;
              }
              local_79 = '\x03';
            }
            else {
              local_60 = ac;
              ac = (array_container_t *)
                   container_from_run_range((run_container_t *)ac,uVar15,uVar27,&local_79);
            }
          }
          else {
            bVar28 = (byte)uVar27;
            bVar5 = (byte)uVar15;
            if (uVar1 == '\x02') {
              uVar4 = ac->cardinality;
              uVar14 = 0;
              uVar26 = 0;
              if (uVar4 != 0) {
                iVar6 = uVar4 - 1;
                uVar26 = 0;
                uVar19 = local_58;
                do {
                  if (iVar6 < (int)uVar26) {
                    uVar18 = ~uVar26;
                    break;
                  }
                  uVar18 = uVar26 + iVar6 >> 1;
                  uVar2 = *(ushort *)((long)ac->array + (ulong)(uVar26 + iVar6 & 0xfffffffe));
                  if (uVar2 < uVar24) {
                    uVar26 = uVar18 + 1;
                    bVar29 = true;
                  }
                  else if (uVar24 < uVar2) {
                    iVar6 = uVar18 - 1;
                    bVar29 = true;
                  }
                  else {
                    bVar29 = false;
                    uVar19 = (ulong)uVar18;
                  }
                  uVar18 = (uint)uVar19;
                } while (bVar29);
                uVar26 = uVar18 + 1;
                if (-1 < (int)uVar18) {
                  uVar26 = ~uVar18;
                }
                uVar26 = uVar26 + uVar4;
              }
              if (uVar4 != uVar26) {
                iVar6 = uVar4 + ~uVar26;
                uVar4 = 0;
                paVar12 = ac;
                do {
                  if (iVar6 < (int)uVar4) {
                    uVar14 = ~uVar4;
                    break;
                  }
                  uVar14 = uVar4 + iVar6 >> 1;
                  paVar13 = (array_container_t *)(ulong)uVar14;
                  uVar24 = *(ushort *)((long)ac->array + (ulong)(uVar4 + iVar6 & 0xfffffffe));
                  if (uVar24 < uVar25) {
                    uVar4 = uVar14 + 1;
                    bVar29 = true;
                    paVar13 = paVar12;
                  }
                  else if (uVar25 < uVar24) {
                    iVar6 = uVar14 - 1;
                    bVar29 = true;
                    paVar13 = paVar12;
                  }
                  else {
                    bVar29 = false;
                  }
                  uVar14 = (uint)paVar13;
                  paVar12 = paVar13;
                } while (bVar29);
                uVar14 = (int)uVar14 >> 0x1f ^ uVar14;
              }
              uVar4 = uVar27 - uVar15;
              iVar6 = uVar4 + uVar14 + uVar26 + 1;
              if (iVar6 == 0x10000) {
                local_79 = '\x03';
                ac = (array_container_t *)run_container_create_given_capacity(1);
joined_r0x00102a29:
                if (ac != (array_container_t *)0x0) {
                  puVar21 = ac->array;
                  iVar6 = ac->cardinality;
                  (puVar21 + (long)iVar6 * 2)[0] = 0;
                  (puVar21 + (long)iVar6 * 2)[1] = 0xffff;
                  ac->cardinality = ac->cardinality + 1;
                }
              }
              else {
                local_50 = (uint16_t *)CONCAT44(local_50._4_4_,iVar6);
                if (iVar6 < 0x1001) {
                  local_79 = '\x02';
                  if (ac->capacity < iVar6) {
                    local_60 = ac;
                    array_container_grow(ac,iVar6,true);
                    ac = local_60;
                  }
                  memmove(ac->array + (int)(uVar4 + uVar14 + 1),
                          ac->array + ((long)ac->cardinality - (long)(int)uVar26),
                          (long)(int)uVar26 * 2);
                  puVar21 = ac->array;
                  lVar7 = (ulong)uVar4 + 1;
                  do {
                    puVar21[uVar14] = (uint16_t)uVar15;
                    uVar14 = uVar14 + 1;
                    uVar15 = uVar15 + 1;
                    lVar7 = lVar7 + -1;
                  } while (lVar7 != 0);
                  ac->cardinality = (int32_t)local_50;
                }
                else {
                  local_79 = '\x01';
                  local_60 = (array_container_t *)bitset_container_from_array(ac);
                  puVar21 = local_60->array;
                  uVar15 = uVar15 >> 6;
                  uVar27 = uVar27 >> 6;
                  if (uVar27 - uVar15 == 0) {
                    *(ulong *)(puVar21 + (ulong)uVar15 * 4) =
                         *(ulong *)(puVar21 + (ulong)uVar15 * 4) |
                         (0xffffffffffffffffU >> (0x3fU - (char)uVar4 & 0x3f)) << (bVar5 & 0x3f);
                  }
                  else {
                    uVar19 = *(ulong *)(puVar21 + (ulong)uVar27 * 4);
                    *(ulong *)(puVar21 + (ulong)uVar15 * 4) =
                         *(ulong *)(puVar21 + (ulong)uVar15 * 4) | -1L << (bVar5 & 0x3f);
                    if (uVar15 + 1 < uVar27) {
                      memset(puVar21 + (ulong)uVar15 * 4 + 4,0xff,
                             (ulong)((uVar27 - uVar15) - 2 >> 1) * 0x10 + 0x10);
                    }
                    *(ulong *)(puVar21 + (ulong)uVar27 * 4) =
                         uVar19 | 0xffffffffffffffffU >> (~bVar28 & 0x3f);
                  }
                  local_60->cardinality = (int32_t)local_50;
                  ac = local_60;
                }
              }
            }
            else {
              uVar4 = uVar27 - uVar15;
              puVar21 = ac->array;
              uVar15 = uVar15 >> 6;
              uVar27 = uVar27 >> 6;
              if (uVar27 == uVar15) {
                uVar19 = *(ulong *)(puVar21 + (ulong)uVar15 * 4) &
                         (0xffffffffffffffffU >> (0x3fU - (char)uVar4 & 0x3f)) << (bVar5 & 0x3f);
                uVar19 = uVar19 - (uVar19 >> 1 & 0x5555555555555555);
                uVar19 = (uVar19 >> 2 & 0x3333333333333333) + (uVar19 & 0x3333333333333333);
                uVar26 = (uint)(byte)(((uVar19 >> 4) + uVar19 & 0xf0f0f0f0f0f0f0f) *
                                      0x101010101010101 >> 0x38);
              }
              else {
                uVar19 = (*(ulong *)(puVar21 + (ulong)uVar15 * 4) >> (bVar5 & 0x3f)) <<
                         (bVar5 & 0x3f);
                uVar19 = uVar19 - (uVar19 >> 1 & 0x5555555555555555);
                uVar19 = (uVar19 >> 2 & 0x3333333333333333) + (uVar19 & 0x3333333333333333);
                uVar19 = ((uVar19 >> 4) + uVar19 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
                uVar8 = uVar19 >> 0x38;
                uVar26 = (uint)(byte)(uVar19 >> 0x38);
                local_50 = (uint16_t *)CONCAT44(local_50._4_4_,uVar27);
                if (uVar15 + 1 < uVar27) {
                  uVar19 = (ulong)(uVar15 + 1);
                  do {
                    uVar20 = *(ulong *)(puVar21 + uVar19 * 4) -
                             (*(ulong *)(puVar21 + uVar19 * 4) >> 1 & 0x5555555555555555);
                    uVar20 = (uVar20 >> 2 & 0x3333333333333333) + (uVar20 & 0x3333333333333333);
                    uVar26 = (int)uVar8 +
                             (uint)(byte)(((uVar20 >> 4) + uVar20 & 0xf0f0f0f0f0f0f0f) *
                                          0x101010101010101 >> 0x38);
                    uVar8 = (ulong)uVar26;
                    uVar19 = uVar19 + 1;
                  } while (uVar27 != uVar19);
                }
                uVar19 = (ulong)(*(long *)(puVar21 + (ulong)uVar27 * 4) << (~bVar28 & 0x3f)) >>
                         (~bVar28 & 0x3f);
                uVar19 = uVar19 - (uVar19 >> 1 & 0x5555555555555555);
                uVar19 = (uVar19 >> 2 & 0x3333333333333333) + (uVar19 & 0x3333333333333333);
                uVar26 = (byte)(((uVar19 >> 4) + uVar19 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                               0x38) + uVar26;
                local_38 = (ulong)uVar4;
              }
              iVar6 = (uVar4 + ac->cardinality + 1) - uVar26;
              if (iVar6 == 0x10000) {
                local_79 = '\x03';
                local_60 = ac;
                ac = (array_container_t *)run_container_create_given_capacity(1);
                goto joined_r0x00102a29;
              }
              local_79 = '\x01';
              if (uVar27 - uVar15 == 0) {
                *(ulong *)(puVar21 + (ulong)uVar15 * 4) =
                     *(ulong *)(puVar21 + (ulong)uVar15 * 4) |
                     (0xffffffffffffffffU >> (0x3fU - (char)uVar4 & 0x3f)) << (bVar5 & 0x3f);
                local_60 = ac;
              }
              else {
                uVar19 = *(ulong *)(puVar21 + (ulong)uVar27 * 4);
                *(ulong *)(puVar21 + (ulong)uVar15 * 4) =
                     *(ulong *)(puVar21 + (ulong)uVar15 * 4) | -1L << (bVar5 & 0x3f);
                local_60 = ac;
                if (uVar15 + 1 < uVar27) {
                  local_50 = puVar21;
                  memset(puVar21 + (ulong)uVar15 * 4 + 4,0xff,
                         (ulong)((uVar27 - uVar15) - 2 >> 1) * 0x10 + 0x10);
                  puVar21 = local_50;
                }
                *(ulong *)(puVar21 + (ulong)uVar27 * 4) =
                     uVar19 | 0xffffffffffffffffU >> (~bVar28 & 0x3f);
              }
              local_60->cardinality = iVar6;
              ac = local_60;
            }
          }
          uVar19 = local_70;
          paVar12 = (array_container_t *)(local_78->high_low_container).containers[local_58];
          if (ac != paVar12) {
            container_free(paVar12,(local_78->high_low_container).typecodes[local_58]);
          }
          uVar4 = local_40 - 1;
        }
        (local_78->high_low_container).keys[lVar9] = (uint16_t)uVar10;
        (local_78->high_low_container).containers[lVar9] = ac;
        (local_78->high_low_container).typecodes[lVar9] = local_79;
        lVar9 = lVar9 + -1;
        bVar29 = uVar10 != (uint)uVar19;
        uVar10 = uVar10 - 1;
      } while (bVar29);
    }
  }
  return;
}

Assistant:

void roaring_bitmap_add_range_closed(roaring_bitmap_t *r, uint32_t min,
                                     uint32_t max) {
    if (min > max) {
        return;
    }

    roaring_array_t *ra = &r->high_low_container;

    uint32_t min_key = min >> 16;
    uint32_t max_key = max >> 16;

    int32_t num_required_containers = max_key - min_key + 1;
    int32_t suffix_length =
        count_greater(ra->keys, ra->size, (uint16_t)max_key);
    int32_t prefix_length =
        count_less(ra->keys, ra->size - suffix_length, (uint16_t)min_key);
    int32_t common_length = ra->size - prefix_length - suffix_length;

    if (num_required_containers > common_length) {
        ra_shift_tail(ra, suffix_length,
                      num_required_containers - common_length);
    }

    int32_t src = prefix_length + common_length - 1;
    int32_t dst = ra->size - suffix_length - 1;
    for (uint32_t key = max_key; key != min_key - 1;
         key--) {  // beware of min_key==0
        uint32_t container_min = (min_key == key) ? (min & 0xffff) : 0;
        uint32_t container_max = (max_key == key) ? (max & 0xffff) : 0xffff;
        container_t *new_container;
        uint8_t new_type;

        if (src >= 0 && ra->keys[src] == key) {
            ra_unshare_container_at_index(ra, (uint16_t)src);
            new_container =
                container_add_range(ra->containers[src], ra->typecodes[src],
                                    container_min, container_max, &new_type);
            if (new_container != ra->containers[src]) {
                container_free(ra->containers[src], ra->typecodes[src]);
            }
            src--;
        } else {
            new_container = container_from_range(&new_type, container_min,
                                                 container_max + 1, 1);
        }
        ra_replace_key_and_container_at_index(ra, dst, (uint16_t)key,
                                              new_container, new_type);
        dst--;
    }
}